

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::put
          (ZoneStringsLoader *this,char *key,ResourceValue *value,UBool noFallback,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t local_5c;
  undefined1 local_58 [4];
  int32_t i;
  ResourceTable timeZonesTable;
  UErrorCode *status_local;
  UBool noFallback_local;
  ResourceValue *value_local;
  char *key_local;
  ZoneStringsLoader *this_local;
  
  timeZonesTable._32_8_ = status;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(local_58,value,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)timeZonesTable._32_8_);
  if (UVar1 == '\0') {
    local_5c = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)local_58,local_5c,(char **)&value_local,value),
          UVar1 != '\0') {
      iVar2 = (*(value->super_UObject)._vptr_UObject[3])();
      if (iVar2 == 2) {
        consumeNamesTable(this,(char *)value_local,value,noFallback,
                          (UErrorCode *)timeZonesTable._32_8_);
      }
      UVar1 = ::U_FAILURE(*(UErrorCode *)timeZonesTable._32_8_);
      if (UVar1 != '\0') {
        return;
      }
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool noFallback,
            UErrorCode &status) {
        ResourceTable timeZonesTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; timeZonesTable.getKeyAndValue(i, key, value); ++i) {
            U_ASSERT(!value.isNoInheritanceMarker());
            if (value.getType() == URES_TABLE) {
                consumeNamesTable(key, value, noFallback, status);
            } else {
                // Ignore fields that aren't tables (e.g., fallbackFormat and regionFormatStandard).
                // All time zone fields are tables.
            }
            if (U_FAILURE(status)) { return; }
        }
    }